

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

void ply_init(p_ply ply)

{
  p_ply ply_local;
  
  ply->element = (p_ply_element)0x0;
  ply->nelements = 0;
  ply->comment = (char *)0x0;
  ply->ncomments = 0;
  ply->obj_info = (char *)0x0;
  ply->nobj_infos = 0;
  ply->idriver = (p_ply_idriver)0x0;
  ply->odriver = (p_ply_odriver)0x0;
  ply->buffer[0] = '\0';
  ply->buffer_token = 0;
  ply->buffer_last = 0;
  ply->buffer_first = 0;
  ply->welement = 0;
  ply->wproperty = 0;
  ply->winstance_index = 0;
  ply->wlength = 0;
  ply->wvalue_index = 0;
  return;
}

Assistant:

static void ply_init(p_ply ply) {
    ply->element = NULL;
    ply->nelements = 0;
    ply->comment = NULL;
    ply->ncomments = 0;
    ply->obj_info = NULL;
    ply->nobj_infos = 0;
    ply->idriver = NULL;
    ply->odriver = NULL;
    ply->buffer[0] = '\0';
    ply->buffer_first = ply->buffer_last = ply->buffer_token = 0;
    ply->welement = 0;
    ply->wproperty = 0;
    ply->winstance_index = 0;
    ply->wlength = 0;
    ply->wvalue_index = 0;
}